

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.cpp
# Opt level: O0

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* pstore::command_line::csv
            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *s)

{
  ulong local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [48];
  ulong local_30;
  size_type epos;
  size_type spos;
  string *local_18;
  string *s_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  spos._7_1_ = 0;
  local_18 = s;
  s_local = (string *)__return_storage_ptr__;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(__return_storage_ptr__);
  epos = 0;
  while( true ) {
    if (epos == 0xffffffffffffffff) {
      return __return_storage_ptr__;
    }
    local_30 = std::__cxx11::string::find((char)local_18,0x2c);
    if (local_30 < epos) break;
    std::__cxx11::string::substr((ulong)local_60,(ulong)local_18);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,local_60);
    std::__cxx11::string::~string((string *)local_60);
    if (local_30 == 0xffffffffffffffff) {
      local_78 = local_30;
    }
    else {
      local_78 = local_30 + 1;
    }
    epos = local_78;
  }
  assert_failed("epos >= spos",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/csv.cpp"
                ,0x19);
}

Assistant:

std::list<std::string> pstore::command_line::csv (std::string const & s) {
    std::list<std::string> result;
    auto spos = std::string::size_type{0};
    while (spos != std::string::npos) {
        auto const epos = s.find (',', spos);
        PSTORE_ASSERT (epos >= spos);
        result.emplace_back (s.substr (spos, epos - spos));
        spos = (epos == std::string::npos) ? epos : epos + 1;
    }
    return result;
}